

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_name.c
# Opt level: O0

obj * oname(obj *obj,char *name)

{
  boolean bVar1;
  size_t sVar2;
  uint local_6c;
  char local_68 [8];
  char buf [63];
  char *pcStack_20;
  int lth;
  char *name_local;
  obj *obj_local;
  
  if (*name == '\0') {
    local_6c = 0;
  }
  else {
    sVar2 = strlen(name);
    local_6c = (int)sVar2 + 1;
  }
  stack0xffffffffffffffdc = local_6c;
  pcStack_20 = name;
  if (0x3f < (int)local_6c) {
    stack0xffffffffffffffdc = 0x3f;
    pcStack_20 = strncpy(local_68,name,0x3e);
    buf[0x36] = '\0';
  }
  obj_local = obj;
  if ((obj->oartifact == '\0') &&
     ((stack0xffffffffffffffdc == 0 ||
      (bVar1 = exist_artifact((int)obj->otyp,pcStack_20), bVar1 == '\0')))) {
    if (stack0xffffffffffffffdc == obj->onamelth) {
      name_local = (char *)obj;
      if (stack0xffffffffffffffdc != 0) {
        strcpy((char *)((long)obj->oextra + (long)(int)obj->oxlth),pcStack_20);
      }
    }
    else {
      name_local = (char *)realloc_obj(obj,(int)obj->oxlth,obj->oextra,stack0xffffffffffffffdc,
                                       pcStack_20);
    }
    if (stack0xffffffffffffffdc != 0) {
      artifact_exists((obj *)name_local,pcStack_20,'\x01');
    }
    if (name_local[0x37] != '\0') {
      if ((obj *)name_local == uswapwep) {
        untwoweapon();
      }
      if ((obj *)name_local == uwep) {
        set_artifact_intrinsic((obj *)name_local,'\x01',0x100,'\x01');
      }
      if ((name_local[0x37] == '\x1a') &&
         (name_local[0x2c] = ',', name_local[0x2d] = '\x01', name_local[0x2e] = '\0',
         name_local[0x2f] = '\0', urole.malenum == 0x15d)) {
        *(uint *)(name_local + 0x4a) = *(uint *)(name_local + 0x4a) & 0xffffefff | 0x1000;
      }
    }
    if (name_local[0x48] == '\x03') {
      update_inventory();
    }
    obj_local = (obj *)name_local;
  }
  return obj_local;
}

Assistant:

struct obj *oname(struct obj *obj, const char *name)
{
	int lth;
	char buf[PL_PSIZ];

	lth = *name ? (int)(strlen(name) + 1) : 0;
	if (lth > PL_PSIZ) {
		lth = PL_PSIZ;
		name = strncpy(buf, name, PL_PSIZ - 1);
		buf[PL_PSIZ - 1] = '\0';
	}
	/* If named artifact exists in the game, do not create another.
	 * Also trying to create an artifact shouldn't de-artifact
	 * it (e.g. Excalibur from prayer). In this case the object
	 * will retain its current name. */
	if (obj->oartifact || (lth && exist_artifact(obj->otyp, name)))
		return obj;

	if (lth == obj->onamelth) {
		/* no need to replace entire object */
		if (lth) strcpy(ONAME(obj), name);
	} else {
		obj = realloc_obj(obj, obj->oxlth,
			      obj->oextra, lth, name);
	}
	if (lth) artifact_exists(obj, name, TRUE);
	if (obj->oartifact) {
	    /* can't dual-wield with artifact as secondary weapon */
	    if (obj == uswapwep) untwoweapon();
	    /* activate warning if you've just named your weapon "Sting" */
	    if (obj == uwep) set_artifact_intrinsic(obj, TRUE, W_WEP, TRUE);
	    /* The Iron Ball of Liberation is rustproof only for convicts. */
	    if (obj->oartifact == ART_IRON_BALL_OF_LIBERATION) {
		obj->owt = 300;	/* magically lightened, but still heavy */
		if (Role_if(PM_CONVICT)) obj->oerodeproof = TRUE;
	    }
	}
	if (carried(obj)) update_inventory();
	return obj;
}